

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool SetHasKeys<std::__cxx11::string,char[21],char[14],char[21],char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *set,char (*key) [21],char (*args) [14],char (*args_1) [21],char (*args_2) [9],
               char (*args_3) [7],char (*args_4) [11],char (*args_5) [7],char (*args_6) [7],
               char (*args_7) [11],char (*args_8) [11])

{
  size_type sVar1;
  char (*in_RCX) [14];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  char (*unaff_RBX) [7];
  char *in_RSI;
  allocator<char> *in_RDI;
  char (*in_R8) [21];
  char (*in_R9) [9];
  char (*unaff_R14) [7];
  long in_FS_OFFSET;
  char (*unaff_retaddr) [11];
  char (*in_stack_00000008) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  key_type *in_stack_ffffffffffffff30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  bool local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char (*in_stack_ffffffffffffff80) [11];
  char (*in_stack_ffffffffffffff88) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_39;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_RSI,in_RDI);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_a1 = true;
  if (sVar1 == 0) {
    local_a1 = SetHasKeys<std::__cxx11::string,char[14],char[21],char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
                         (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80,unaff_RBX,unaff_R14,unaff_retaddr,
                          in_stack_00000008);
    in_stack_ffffffffffffff28 = in_stack_00000010;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_a1;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool SetHasKeys(const std::set<T>& set, const Tk& key, const Args&... args)
{
    return (set.count(key) != 0) || SetHasKeys(set, args...);
}